

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::PRE::MakePropertySymLiveOnBackEdges
          (PRE *this,PropertySym *propertySym,Loop *loop,Value *valueToAdd)

{
  code *pcVar1;
  bool bVar2;
  BasicBlock *pBVar3;
  undefined4 *puVar4;
  Type *ppFVar5;
  undefined1 local_40 [8];
  Iterator __iter;
  
  pBVar3 = Loop::GetHeadBlock(loop);
  local_40 = (undefined1  [8])&pBVar3->predList;
  __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_00447f2b;
      *puVar4 = 0;
    }
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_40) {
      return;
    }
    ppFVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_40);
    pBVar3 = (*ppFVar5)->predBlock;
    if (pBVar3 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x461b,"(blockPred)","blockPred");
      if (!bVar2) {
LAB_00447f2b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = Loop::IsDescendentOrSelf(loop,pBVar3->loop);
    if (bVar2) {
      GlobOptBlockData::SetValue(&pBVar3->globOptData,valueToAdd,&propertySym->super_Sym);
      BVSparse<Memory::JitArenaAllocator>::Set
                ((pBVar3->globOptData).liveFields,(propertySym->super_Sym).m_id);
    }
  } while( true );
}

Assistant:

void
GlobOpt::PRE::MakePropertySymLiveOnBackEdges(PropertySym * propertySym, Loop * loop, Value * valueToAdd)
{
    BasicBlock * loopHeader = loop->GetHeadBlock();
    FOREACH_PREDECESSOR_BLOCK(blockPred, loopHeader)
    {
        if (!loop->IsDescendentOrSelf(blockPred->loop))
        {
            // Not a loop back-edge
            continue;
        }

        // Insert it in the value table
        blockPred->globOptData.SetValue(valueToAdd, propertySym);

        // Make it a live field
        blockPred->globOptData.liveFields->Set(propertySym->m_id);
    } NEXT_PREDECESSOR_BLOCK;
}